

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

null_terminating_iterator<wchar_t> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
          (internal *this,null_terminating_iterator<wchar_t> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
          *handler)

{
  uint uVar1;
  internal *piVar2;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  *this_00;
  long lVar3;
  internal *piVar4;
  basic_string_view<wchar_t> id;
  null_terminating_iterator<wchar_t> nVar5;
  null_terminating_iterator<wchar_t> local_20;
  
  this_00 = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
             *)it.end_;
  piVar4 = (internal *)it.ptr_;
  local_20.end_ = (wchar_t *)piVar4;
  local_20.ptr_ = (wchar_t *)this;
  if (this == piVar4) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint *)this;
    if ((uVar1 == 0x7d) || (uVar1 == 0x3a)) {
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::operator()(this_00);
      local_20.end_ = (wchar_t *)piVar4;
      goto LAB_0011d540;
    }
    if (uVar1 - 0x30 < 10) {
      uVar1 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
                        (&local_20,this_00);
      if ((local_20.ptr_ == local_20.end_) || ((*local_20.ptr_ != 0x3a && (*local_20.ptr_ != 0x7d)))
         ) {
        id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
        ::on_error(this_00,"invalid format string");
      }
      else {
        id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
        ::operator()(this_00,uVar1);
      }
      goto LAB_0011d540;
    }
  }
  if ((uVar1 == 0x5f) || ((uVar1 & 0xffffffdf) - 0x41 < 0x1a)) {
    lVar3 = 0;
    piVar2 = this + 4;
    do {
      local_20.ptr_ = (wchar_t *)piVar2;
      uVar1 = 0;
      if ((internal *)local_20.ptr_ != piVar4) {
        uVar1 = *local_20.ptr_;
      }
      piVar2 = (internal *)((long)local_20.ptr_ + 4);
      lVar3 = lVar3 + 4;
    } while (((uVar1 - 0x30 < 10) || (uVar1 == 0x5f)) || ((uVar1 & 0xffffffdf) - 0x41 < 0x1a));
    id.size_ = lVar3 >> 2;
    id.data_ = (wchar_t *)this;
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
    ::operator()(this_00,id);
    local_20.end_ = (wchar_t *)piVar4;
  }
  else {
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
    ::on_error(this_00,"invalid format string");
    local_20.end_ = (wchar_t *)piVar4;
  }
LAB_0011d540:
  nVar5.end_ = local_20.end_;
  nVar5.ptr_ = local_20.ptr_;
  return nVar5;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}